

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::attrItemStruct(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  uint uVar1;
  int iVar2;
  ASTArray *pAVar3;
  NoViableAltException *pNVar4;
  AST *pAVar5;
  AST *pAVar6;
  AST *pAVar7;
  AST *pAVar8;
  undefined1 local_c0 [8];
  RefAST tmp111_AST;
  RefCount<AST> local_b0;
  RefAST X_AST;
  RefCount<AST> local_a0;
  RefCount<AST> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST tmp109_AST;
  ASTPair currentAST;
  RefAST local_50;
  RefAST local_48;
  RefToken local_40;
  RefToken local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b0.ref = nullAST.ref;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 3;
  }
  local_a0.ref = local_b0.ref;
  X_AST.ref = local_b0.ref;
  attrName(this);
  RefCount<AST>::operator=(&local_a0,this_00);
  tmp109_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp111_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp109_AST,&tmp111_AST);
  RefCount<AST>::~RefCount(&tmp111_AST);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,0xb);
  uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  switch(uVar1) {
  case 8:
  case 0xc:
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
switchD_00172858_caseD_9:
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_38);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  default:
    if ((0x3f < uVar1) || ((0xe000000000800000U >> ((ulong)uVar1 & 0x3f) & 1) == 0))
    goto switchD_00172858_caseD_9;
  case 0xd:
  case 0x11:
    attrItemList(this);
    RefCount<AST>::operator=(&X_AST,this_00);
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  tmp111_AST = nullAST;
  if (iVar2 != 0xc) {
    if (iVar2 != 8) {
      pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
      NoViableAltException::NoViableAltException(pNVar4,&local_40);
      __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    ASTFactory::create((ASTFactory *)local_c0,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp111_AST,(RefCount<AST> *)local_c0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
    RefCount<Token>::~RefCount(&local_80);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount(&tmp111_AST);
  }
  tmp111_AST.ref = nullAST.ref;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)local_c0,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp111_AST,(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,0xc);
  RefCount<AST>::operator=(&local_b0,&currentAST.root);
  pAVar3 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar3,3);
  ASTFactory::create(&local_90,(int)nodes);
  pAVar3 = ASTArray::add(pAVar3,(RefAST *)&local_90);
  if (local_a0.ref != (Ref *)0x0) {
    (local_a0.ref)->count = (local_a0.ref)->count + 1;
  }
  local_48.ref = local_a0.ref;
  pAVar3 = ASTArray::add(pAVar3,&local_48);
  if (X_AST.ref != (Ref *)0x0) {
    (X_AST.ref)->count = (X_AST.ref)->count + 1;
  }
  local_50.ref = X_AST.ref;
  ASTArray::add(pAVar3,&local_50);
  ASTFactory::make((ASTFactory *)local_c0,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_b0,(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount(&local_50);
  RefCount<AST>::~RefCount(&local_48);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
  RefCount<AST>::operator=(&currentAST.root,&local_b0);
  if (local_b0.ref == (Ref *)0x0) {
    pAVar8 = (AST *)0x0;
  }
  else {
    pAVar8 = (local_b0.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar7 = (AST *)0x0;
  }
  else {
    pAVar7 = (nullAST.ref)->ptr;
  }
  if (pAVar8 != pAVar7) {
    AST::getFirstChild((local_b0.ref)->ptr);
    if (local_98.ref == (Ref *)0x0) {
      pAVar5 = (AST *)0x0;
    }
    else {
      pAVar5 = (local_98.ref)->ptr;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = (nullAST.ref)->ptr;
    }
    if (pAVar5 != pAVar6) {
      AST::getFirstChild((local_b0.ref)->ptr);
      goto LAB_00172aa6;
    }
  }
  if (local_b0.ref != (Ref *)0x0) {
    (local_b0.ref)->count = (local_b0.ref)->count + 1;
  }
  local_c0 = (undefined1  [8])local_b0.ref;
LAB_00172aa6:
  RefCount<AST>::operator=(&currentAST.child,(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  if (pAVar8 != pAVar7) {
    RefCount<AST>::~RefCount(&local_98);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  RefCount<AST>::~RefCount(&tmp111_AST);
  RefCount<AST>::~RefCount(&tmp109_AST);
  RefCount<AST>::operator=(this_00,&local_b0);
  RefCount<AST>::~RefCount(&X_AST);
  RefCount<AST>::~RefCount(&local_a0);
  RefCount<AST>::~RefCount(&local_b0);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::attrItemStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST attrItemStruct_AST = nullAST;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		attrName();
		I_AST = returnAST;
		}
		RefAST tmp109_AST = nullAST;
		tmp109_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		case LITERAL_glyph:
		case LITERAL_justify:
		case LITERAL_min:
		case LITERAL_max:
		{
			attrItemList();
			X_AST = returnAST;
			break;
		}
		case OP_SEMI:
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp110_AST = nullAST;
			tmp110_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp111_AST = nullAST;
		tmp111_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		attrItemStruct_AST = currentAST.root;
		attrItemStruct_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(ZdotStruct))->add(I_AST)->add(X_AST));
		currentAST.root = attrItemStruct_AST;
		currentAST.child = attrItemStruct_AST!=nullAST &&attrItemStruct_AST->getFirstChild()!=nullAST ?
			attrItemStruct_AST->getFirstChild() : attrItemStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_34);
	}
	returnAST = attrItemStruct_AST;
}